

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlEntityDesc * htmlEntityLookup(xmlChar *name)

{
  int iVar1;
  uint local_1c;
  uint i;
  xmlChar *name_local;
  
  local_1c = 0;
  while( true ) {
    if (0xfc < local_1c) {
      return (htmlEntityDesc *)0x0;
    }
    iVar1 = xmlStrEqual(name,(xmlChar *)html40EntitiesTable[local_1c].name);
    if (iVar1 != 0) break;
    local_1c = local_1c + 1;
  }
  return html40EntitiesTable + local_1c;
}

Assistant:

const htmlEntityDesc *
htmlEntityLookup(const xmlChar *name) {
    unsigned int i;

    for (i = 0;i < (sizeof(html40EntitiesTable)/
                    sizeof(html40EntitiesTable[0]));i++) {
        if (xmlStrEqual(name, BAD_CAST html40EntitiesTable[i].name)) {
            return((htmlEntityDescPtr) &html40EntitiesTable[i]);
	}
    }
    return(NULL);
}